

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O2

void test_text(void)

{
  FILE *__stream;
  int line;
  int line_00;
  uint uVar1;
  uint *puVar2;
  char *pcVar3;
  int in_ECX;
  int in_EDX;
  int family;
  int sock;
  int in_ESI;
  int option;
  void *in_R9;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  int opt;
  uint8_t bad [20];
  undefined1 local_428 [1024];
  
  line = test_socket_impl((char *)0x2e,in_ESI,in_EDX,in_ECX);
  line_00 = test_socket_impl((char *)0x2f,in_ESI,family,in_ECX);
  nn_sleep(200);
  option = (int)&opt;
  opt = 1;
  test_setsockopt_impl
            ((char *)0x35,line,-4,1,option,in_R9,
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  opt = 1;
  test_setsockopt_impl
            ((char *)0x37,line_00,-4,1,option,in_R9,
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  opt = 500;
  pcVar3 = (char *)0x5;
  test_setsockopt_impl
            ((char *)0x39,line,0,5,option,in_R9,
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  test_bind_impl((char *)0x3b,line,0x1050e0,pcVar3);
  test_connect_impl((char *)0x3c,line_00,sock,pcVar3);
  test_send_impl((char *)0x3e,line_00,0x103105,pcVar3);
  test_recv_impl((char *)0x3f,line,0x103105,pcVar3);
  bad[4] = '\0';
  bad[0] = 'B';
  bad[1] = 'A';
  bad[2] = 0xdd;
  bad[3] = '.';
  test_send_impl((char *)0x44,line_00,(int)bad,pcVar3);
  uVar1 = nn_recv(line,local_428,0x400,0);
  if (-1 < (int)uVar1) {
    fprintf(_stderr,"Did not drop message: [%d bytes] (%s:%d)\n",(ulong)uVar1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
            0x47);
    nn_err_abort();
  }
  puVar2 = (uint *)__errno_location();
  __stream = _stderr;
  if (*puVar2 == 0x6e) {
    return;
  }
  pcVar3 = nn_err_strerror(*puVar2);
  fprintf(__stream,"Got wrong err to recv: %s [%d != %d] (%s:%d)\n",pcVar3,(ulong)*puVar2,0x6e,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",0x47)
  ;
  nn_err_abort();
}

Assistant:

void test_text() {

    int sb;
    int sc;
    int opt;
    uint8_t bad[20];

    /*  Negative testing... bad UTF-8 data for text. */
    sb = test_socket (AF_SP, NN_PAIR);
    sc = test_socket (AF_SP, NN_PAIR);

    /*  Wait for connects to establish. */
    nn_sleep (200);

    opt = NN_WS_MSG_TYPE_TEXT;
    test_setsockopt(sb, NN_WS, NN_WS_MSG_TYPE, &opt, sizeof (opt));
    opt = NN_WS_MSG_TYPE_TEXT;
    test_setsockopt(sc, NN_WS, NN_WS_MSG_TYPE, &opt, sizeof (opt));
    opt = 500;
    test_setsockopt(sb, NN_SOL_SOCKET, NN_RCVTIMEO, &opt, sizeof (opt));

    test_bind (sb, socket_address);
    test_connect (sc, socket_address);

    test_send (sc, "GOOD");
    test_recv (sb, "GOOD");

    /*  and the bad ... */
    strcpy((char *)bad, "BAD.");
    bad[2] = (char)0xDD;
    test_send (sc, (char *)bad);

    /*  Make sure we dropped the frame. */
    test_drop (sb, ETIMEDOUT);
}